

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

void __thiscall
pbrt::BilinearPatch::BilinearPatch
          (BilinearPatch *this,BilinearPatchMesh *mesh,int meshIndex,int blpIndex)

{
  Point3f *pPVar1;
  Point3f *pPVar2;
  Point3f *pPVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar12;
  int iVar17;
  int *piVar18;
  Point3f *pPVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  bool bVar23;
  long lVar24;
  undefined4 *puVar25;
  undefined1 *puVar26;
  undefined4 *puVar27;
  long lVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM19 [16];
  Point3f p [4] [4];
  undefined1 local_f8 [52];
  ulong uStack_c4;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x3d0) = *(long *)(in_FS_OFFSET + -0x3d0) + 0xc;
  piVar18 = mesh->vertexIndices;
  lVar24 = (long)(blpIndex << 2);
  pPVar19 = mesh->p;
  iVar17 = piVar18[lVar24 + 3];
  pPVar1 = pPVar19 + piVar18[lVar24];
  pPVar2 = pPVar19 + piVar18[lVar24 + 1];
  pPVar3 = pPVar19 + piVar18[lVar24 + 2];
  bVar23 = IsRectangle(this,mesh);
  if (bVar23) {
    fVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
    auVar36._4_4_ = fVar4;
    auVar36._0_4_ = fVar4;
    auVar36._8_4_ = fVar4;
    auVar36._12_4_ = fVar4;
    fVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
    auVar40._4_4_ = fVar4;
    auVar40._0_4_ = fVar4;
    auVar40._8_4_ = fVar4;
    auVar40._12_4_ = fVar4;
    auVar35 = vinsertps_avx(ZEXT416((uint)(pPVar3->super_Tuple3<pbrt::Point3,_float>).x),
                            ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).x),0x10);
    auVar41 = vsubps_avx(auVar36,auVar35);
    auVar35 = vinsertps_avx(ZEXT416((uint)(pPVar3->super_Tuple3<pbrt::Point3,_float>).y),
                            ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).y),0x10);
    fVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
    auVar39._4_4_ = fVar4;
    auVar39._0_4_ = fVar4;
    auVar39._8_4_ = fVar4;
    auVar39._12_4_ = fVar4;
    auVar34 = vsubps_avx(auVar40,auVar35);
    auVar35 = vinsertps_avx(ZEXT416((uint)(pPVar3->super_Tuple3<pbrt::Point3,_float>).z),
                            ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).z),0x10);
    auVar35 = vsubps_avx(auVar39,auVar35);
    auVar37._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ + auVar34._0_4_ * auVar34._0_4_ +
         auVar35._0_4_ * auVar35._0_4_;
    auVar37._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ + auVar34._4_4_ * auVar34._4_4_ +
         auVar35._4_4_ * auVar35._4_4_;
    auVar37._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ + auVar34._8_4_ * auVar34._8_4_ +
         auVar35._8_4_ * auVar35._8_4_;
    auVar37._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ + auVar34._12_4_ * auVar34._12_4_ +
         auVar35._12_4_ * auVar35._12_4_;
    auVar41 = vsqrtps_avx(auVar37);
    auVar35 = vmovshdup_avx(auVar41);
    auVar38 = ZEXT464((uint)(auVar41._0_4_ * auVar35._0_4_));
  }
  else {
    _local_f8 = ZEXT1664(ZEXT816(0) << 0x40);
    puVar25 = (undefined4 *)(local_f8 + 8);
    local_78 = _local_f8;
    local_b8 = _local_f8;
    fVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
    fVar5 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
    fVar6 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
    uVar8 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
    uVar13 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
    auVar35._4_4_ = uVar13;
    auVar35._0_4_ = uVar8;
    auVar35._8_8_ = 0;
    uVar9 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
    uVar14 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
    auVar41._4_4_ = uVar14;
    auVar41._0_4_ = uVar9;
    auVar41._8_8_ = 0;
    uVar10 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
    uVar15 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
    uVar11 = pPVar19[iVar17].super_Tuple3<pbrt::Point3,_float>.x;
    uVar16 = pPVar19[iVar17].super_Tuple3<pbrt::Point3,_float>.y;
    fVar7 = pPVar19[iVar17].super_Tuple3<pbrt::Point3,_float>.z;
    lVar24 = 0;
    do {
      auVar34 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar24);
      lVar28 = 0;
      auVar32._0_4_ = auVar34._0_4_ / 3.0;
      auVar32._4_12_ = auVar34._4_12_;
      fVar20 = 1.0 - auVar32._0_4_;
      auVar34._4_4_ = fVar20;
      auVar34._0_4_ = fVar20;
      auVar34._8_4_ = fVar20;
      auVar34._12_4_ = fVar20;
      puVar27 = puVar25;
      do {
        auVar29 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar28);
        lVar28 = lVar28 + 1;
        auVar33._0_4_ = auVar29._0_4_ / 3.0;
        auVar33._4_12_ = auVar29._4_12_;
        fVar21 = 1.0 - auVar33._0_4_;
        auVar29 = vmulss_avx512f(auVar33,ZEXT416((uint)fVar5));
        auVar30 = vmulss_avx512f(auVar33,ZEXT416((uint)fVar7));
        auVar44._4_4_ = auVar33._0_4_;
        auVar44._0_4_ = auVar33._0_4_;
        auVar44._8_4_ = auVar33._0_4_;
        auVar44._12_4_ = auVar33._0_4_;
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)fVar4));
        auVar29 = vaddss_avx512f(auVar31,auVar29);
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)fVar6));
        auVar45._4_4_ = fVar21;
        auVar45._0_4_ = fVar21;
        auVar45._8_4_ = fVar21;
        auVar45._12_4_ = fVar21;
        auVar30 = vaddss_avx512f(auVar31,auVar30);
        auVar29 = vmulss_avx512f(ZEXT416((uint)fVar20),auVar29);
        auVar31 = vmulps_avx512vl(auVar44,auVar41);
        auVar30 = vmulss_avx512f(auVar32,auVar30);
        auVar29 = vaddss_avx512f(auVar29,auVar30);
        auVar30 = vmulps_avx512vl(auVar45,auVar35);
        auVar30 = vaddps_avx512vl(auVar30,auVar31);
        auVar30 = vmulps_avx512vl(auVar34,auVar30);
        auVar31._0_4_ = auVar32._0_4_ * (fVar21 * (float)uVar10 + auVar33._0_4_ * (float)uVar11);
        auVar31._4_4_ = auVar32._0_4_ * (fVar21 * (float)uVar15 + auVar33._0_4_ * (float)uVar16);
        auVar31._8_4_ = auVar32._0_4_ * (fVar21 * 0.0 + auVar33._0_4_ * 0.0);
        auVar31._12_4_ = auVar32._0_4_ * (fVar21 * 0.0 + auVar33._0_4_ * 0.0);
        auVar30 = vaddps_avx512vl(auVar30,auVar31);
        uVar12 = vmovlps_avx(auVar30);
        *(undefined8 *)(puVar27 + -2) = uVar12;
        *puVar27 = auVar29._0_4_;
        puVar27 = puVar27 + 3;
      } while (lVar28 != 4);
      lVar24 = lVar24 + 1;
      puVar25 = puVar25 + 0xc;
    } while (lVar24 != 4);
    puVar26 = local_b8;
    auVar38 = ZEXT864(0);
    lVar24 = 0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_f8._4_8_;
    do {
      lVar24 = lVar24 + 1;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(local_f8 + lVar24 * 0x30 + 4);
      lVar28 = 0;
      auVar41 = vmovshdup_avx(auVar30);
      auVar35 = vinsertps_avx(ZEXT416((uint)*(float *)(local_f8 + lVar24 * 0x30)),auVar30,0x1c);
      do {
        lVar22 = lVar28 + -4;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(puVar26 + lVar28);
        fVar4 = *(float *)(puVar26 + lVar22) - (float)local_f8._0_4_;
        auVar31 = vsubps_avx(auVar43,auVar29);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(puVar26 + lVar28 + -0x30);
        local_f8._0_4_ = *(undefined4 *)(puVar26 + lVar28 + -0x34);
        lVar28 = lVar28 + 0xc;
        auVar32 = vmovshdup_avx(auVar29);
        auVar34 = vinsertps_avx(ZEXT416((uint)local_f8._0_4_),auVar29,0x1c);
        auVar34 = vsubps_avx(auVar35,auVar34);
        fVar5 = auVar41._0_4_ - auVar32._0_4_;
        auVar35 = vmovshdup_avx(auVar31);
        auVar32 = vmulps_avx512vl(auVar31,auVar34);
        auVar33 = vpermt2ps_avx512vl(auVar34,_DAT_003c76c0,ZEXT416((uint)fVar5));
        auVar35 = vfmsub213ss_fma(auVar35,auVar34,ZEXT416((uint)(fVar4 * fVar5)));
        auVar34 = vfnmadd213ps_avx512vl(auVar34,auVar31,auVar32);
        auVar31 = vpermt2ps_avx512vl(auVar31,SUB6416(ZEXT464(4),0),ZEXT416((uint)fVar4));
        auVar41 = vfnmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),ZEXT416((uint)fVar4),
                                   ZEXT416((uint)fVar5));
        auVar32 = vfmsub213ps_avx512vl(auVar33,auVar31,auVar32);
        fVar4 = auVar35._0_4_ + auVar41._0_4_;
        auVar35 = vaddps_avx512vl(auVar34,auVar32);
        auVar42._0_4_ = auVar35._0_4_ * auVar35._0_4_;
        auVar42._4_4_ = auVar35._4_4_ * auVar35._4_4_;
        auVar42._8_4_ = auVar35._8_4_ * auVar35._8_4_;
        auVar42._12_4_ = auVar35._12_4_ * auVar35._12_4_;
        auVar41 = vmovshdup_avx(auVar42);
        auVar35 = vinsertps_avx(ZEXT416((uint)*(float *)(puVar26 + lVar22)),auVar43,0x1c);
        auVar41 = ZEXT416((uint)(auVar42._0_4_ + auVar41._0_4_ + fVar4 * fVar4));
        auVar41 = vsqrtss_avx(auVar41,auVar41);
        auVar41 = vfmadd231ss_fma(auVar38._0_16_,auVar41,SUB6416(ZEXT464(0x3f000000),0));
        auVar38 = ZEXT1664(auVar41);
        auVar41 = vmovshdup_avx(auVar43);
      } while (lVar28 != 0x24);
      puVar26 = puVar26 + 0x30;
      local_f8._0_4_ = *(float *)(local_f8 + lVar24 * 0x30);
      auVar29 = auVar30;
    } while (lVar24 != 3);
  }
  this->area = auVar38._0_4_;
  return;
}

Assistant:

BilinearPatch::BilinearPatch(const BilinearPatchMesh *mesh, int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];
    if (IsRectangle(mesh))
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}